

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_threadnames_tests.cpp
# Opt level: O3

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
util_threadnames_tests::RenameEnMasse_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,util_threadnames_tests *this,int num_threads)

{
  _Rb_tree_header *p_Var1;
  pointer ptVar2;
  pointer ptVar3;
  ulong uVar4;
  allocator_type *paVar5;
  allocator_type *paVar6;
  undefined8 uVar7;
  thread __args_1;
  thread *thread;
  ulong uVar8;
  allocator_type *paVar9;
  uint uVar10;
  uint uVar11;
  anon_class_16_2_f7c77348_for__M_head_impl *__args;
  ulong __n;
  long in_FS_OFFSET;
  anon_class_16_2_f7c77348_for__M_head_impl RenameThisThread;
  mutex lock;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  thread local_98;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  vector<std::thread,_std::allocator<std::thread>_> local_58;
  long local_38;
  
  uVar10 = (uint)this;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __args_1._M_id._M_thread = (id)&local_88;
  local_68 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98._M_id._M_thread = __args_1._M_id._M_thread;
  local_90 = __return_storage_ptr__;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&local_58,(long)(int)uVar10);
  paVar9 = (allocator_type *)
           local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar5 = (allocator_type *)
           local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (0 < (int)uVar10) {
    __args = (anon_class_16_2_f7c77348_for__M_head_impl *)0x0;
    do {
      ptVar3 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar2 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        if ((long)local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar7 = std::__throw_length_error("vector::_M_realloc_insert");
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&__return_storage_ptr__->_M_t);
            std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar7);
            }
          }
          goto LAB_0075205e;
        }
        uVar8 = (long)local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                      .super__Vector_impl_data._M_start >> 3;
        uVar4 = uVar8 + (uVar8 == 0);
        __n = uVar4 + uVar8;
        __args_1._M_id._M_thread = (id)0xfffffffffffffff;
        if (0xffffffffffffffe < __n) {
          __n = 0xfffffffffffffff;
        }
        if (CARRY8(uVar4,uVar8)) {
          __n = 0xfffffffffffffff;
        }
        if (__n == 0) {
          paVar5 = (allocator_type *)0x0;
        }
        else {
          paVar5 = (allocator_type *)
                   __gnu_cxx::new_allocator<std::thread>::allocate
                             ((new_allocator<std::thread> *)&local_58,__n,(void *)0x0);
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,util_threadnames_tests::RenameEnMasse[abi:cxx11](int)::__0&,int&>
                  (paVar5 + uVar8 * 8,&local_98,__args,(int *)__args_1._M_id._M_thread);
        paVar9 = paVar5;
        for (paVar6 = (allocator_type *)ptVar2; paVar6 != (allocator_type *)ptVar3;
            paVar6 = paVar6 + 8) {
          __args_1._M_id._M_thread = *(id *)paVar6;
          *(id *)paVar9 = __args_1._M_id._M_thread;
          *(id *)paVar6 = (id)0x0;
          paVar9 = paVar9 + 8;
        }
        if ((allocator_type *)ptVar2 != (allocator_type *)0x0) {
          operator_delete(ptVar2,(long)local_58.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ptVar2);
        }
        local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(paVar5 + __n * 8);
        local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)paVar5;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,util_threadnames_tests::RenameEnMasse[abi:cxx11](int)::__0&,int&>
                  ((allocator_type *)
                   local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_98,__args,
                   (int *)__args_1._M_id._M_thread);
        paVar9 = (allocator_type *)
                 local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(paVar9 + 8);
      uVar11 = (int)__args + 1;
      __args = (anon_class_16_2_f7c77348_for__M_head_impl *)(ulong)uVar11;
      paVar9 = (allocator_type *)
               local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar5 = (allocator_type *)
               local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (uVar11 != uVar10);
  }
  for (; paVar9 != paVar5; paVar9 = paVar9 + 8) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0075205e:
  __stack_chk_fail();
}

Assistant:

std::set<std::string> RenameEnMasse(int num_threads)
{
    std::vector<std::thread> threads;
    std::set<std::string> names;
    std::mutex lock;

    auto RenameThisThread = [&](int i) {
        util::ThreadRename(TEST_THREAD_NAME_BASE + ToString(i));
        std::lock_guard<std::mutex> guard(lock);
        names.insert(util::ThreadGetInternalName());
    };

    threads.reserve(num_threads);
    for (int i = 0; i < num_threads; ++i) {
        threads.emplace_back(RenameThisThread, i);
    }

    for (std::thread& thread : threads) thread.join();

    return names;
}